

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_1e1c32d::SeedSlow(CSHA512 *hasher,RNGState *rng)

{
  long lVar1;
  uchar *in_RSI;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  uchar buffer [32];
  RNGState *in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  CSHA512 *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SeedFast((CSHA512 *)0xffa0b5);
  GetOSRand(in_RSI);
  CSHA512::Write(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                 (size_t)in_stack_ffffffffffffffd8);
  RNGState::SeedEvents(in_stack_ffffffffffffffd8,in_RDI);
  SeedTimestamp((CSHA512 *)0xffa0ef);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedSlow(CSHA512& hasher, RNGState& rng) noexcept
{
    unsigned char buffer[32];

    // Everything that the 'fast' seeder includes
    SeedFast(hasher);

    // OS randomness
    GetOSRand(buffer);
    hasher.Write(buffer, sizeof(buffer));

    // Add the events hasher into the mix
    rng.SeedEvents(hasher);

    // High-precision timestamp.
    //
    // Note that we also commit to a timestamp in the Fast seeder, so we indirectly commit to a
    // benchmark of all the entropy gathering sources in this function).
    SeedTimestamp(hasher);
}